

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestOneofParsingLite::_InternalSerialize
          (TestOneofParsingLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t num;
  string *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  pointer pcVar5;
  size_type sVar6;
  int value;
  string_view s;
  
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 1:
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,*(int32_t *)&this->field_0,target);
    goto switchD_001a6ee6_default;
  case 2:
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,*(MessageLite **)&this->field_0,
                        (int)(*(MessageLite **)&this->field_0)[1]._internal_metadata_.ptr_,target,
                        stream);
    goto switchD_001a6ee6_default;
  case 3:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar5 = (pointer)*puVar2;
    sVar6 = puVar2[1];
    num = 3;
    break;
  case 4:
    psVar1 = _internal_oneof_bytes_abi_cxx11_(this);
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar6 = psVar1->_M_string_length;
    num = 4;
    break;
  case 5:
    psVar1 = _internal_oneof_string_cord_abi_cxx11_(this);
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar6 = psVar1->_M_string_length;
    num = 5;
    break;
  case 6:
    target = google::protobuf::io::EpsCopyOutputStream::WriteBytes<absl::lts_20250127::Cord>
                       (stream,6,(this->field_0)._impl_.oneof_field_.oneof_bytes_cord_,target);
    goto switchD_001a6ee6_default;
  case 7:
    puVar2 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar5 = (pointer)*puVar2;
    sVar6 = puVar2[1];
    num = 7;
    break;
  case 8:
    psVar1 = _internal_oneof_bytes_string_piece_abi_cxx11_(this);
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar6 = psVar1->_M_string_length;
    num = 8;
    break;
  case 9:
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if ((this->field_0)._impl_._oneof_case_[0] == 9) {
      value = *(int *)&this->field_0;
    }
    else {
      value = 1;
    }
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(9,value,puVar4);
  default:
    goto switchD_001a6ee6_default;
  }
  s._M_str = pcVar5;
  s._M_len = sVar6;
  target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,num,s,target);
switchD_001a6ee6_default:
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffe;
    puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneofParsingLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneofParsingLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestOneofParsingLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.oneof_field_case()) {
    case kOneofInt32: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_oneof_int32(), target);
      break;
    }
    case kOneofSubmessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          2, *this_._impl_.oneof_field_.oneof_submessage_, this_._impl_.oneof_field_.oneof_submessage_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(3, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(4, _s, target);
      break;
    }
    case kOneofStringCord: {
      const ::std::string& _s = this_._internal_oneof_string_cord();
      target = stream->WriteStringMaybeAliased(5, _s, target);
      break;
    }
    case kOneofBytesCord: {
      target = stream->WriteBytes(6, this_._internal_oneof_bytes_cord(), target);
      break;
    }
    case kOneofStringStringPiece: {
      const ::std::string& _s = this_._internal_oneof_string_string_piece();
      target = stream->WriteStringMaybeAliased(7, _s, target);
      break;
    }
    case kOneofBytesStringPiece: {
      const ::std::string& _s = this_._internal_oneof_bytes_string_piece();
      target = stream->WriteBytesMaybeAliased(8, _s, target);
      break;
    }
    case kOneofEnum: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          9, this_._internal_oneof_enum(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestOneofParsingLite)
  return target;
}